

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseMessageTest_FieldDefaults_Test::TestBody
          (ParseMessageTest_FieldDefaults_Test *this)

{
  ParserTest::ExpectParsesTo
            (&this->super_ParseMessageTest,
             "message TestMessage {\n  required int32  foo = 1 [default=  1  ];\n  required int32  foo = 1 [default= -2  ];\n  required int64  foo = 1 [default=  3  ];\n  required int64  foo = 1 [default= -4  ];\n  required uint32 foo = 1 [default=  5  ];\n  required uint64 foo = 1 [default=  6  ];\n  required float  foo = 1 [default=  7.5];\n  required float  foo = 1 [default= -8.5];\n  required float  foo = 1 [default=  9  ];\n  required double foo = 1 [default= 10.5];\n  required double foo = 1 [default=-11.5];\n  required double foo = 1 [default= 12  ];\n  required double foo = 1 [default= inf ];\n  required double foo = 1 [default=-inf ];\n  required double foo = 1 [default= nan ];\n  required double foo = 1 [default= -nan ];\n  required string foo = 1 [default=\'13\\001\'];\n  required string foo = 1 [default=\'a\' \"b\" \n \"c\"];\n  required bytes  foo = 1 [default=\'14\\002\'];\n  required bytes  foo = 1 [default=\'a\' \"b\" \n \'c\'];\n  required bool   foo = 1 [default=true ];\n  required Foo    foo = 1 [default=FOO  ];\n  required int32  foo = 1 [default= 0x7FFFFFFF];\n  required int32  foo = 1 [default=-0x80000000];\n  required uint32 foo = 1 [default= 0xFFFFFFFF];\n  required int64  foo = 1 [default= 0x7FFFFFFFFFFFFFFF];\n  required int64  foo = 1 [default=-0x8000000000000000];\n  required uint64 foo = 1 [default= 0xFFFFFFFFFFFFFFFF];\n  required double foo = 1 [default= 0xabcd];\n}\n"
             ,
             "message_type {  name: \"TestMessage\"  field { type:TYPE_INT32   default_value:\"1\"         name:\"foo\" label:LABEL_REQUIRED number:1 }  field { type:TYPE_INT32   default_value:\"-2\"        name:\"foo\" label:LABEL_REQUIRED number:1 }  field { type:TYPE_INT64   default_value:\"3\"         name:\"foo\" label:LABEL_REQUIRED number:1 }  field { type:TYPE_INT64   default_value:\"-4\"        name:\"foo\" label:LABEL_REQUIRED number:1 }  field { type:TYPE_UINT32  default_value:\"5\"         name:\"foo\" label:LABEL_REQUIRED number:1 }  field { type:TYPE_UINT64  default_value:\"6\"         name:\"foo\" label:LABEL_REQUIRED number:1 }  field { type:TYPE_FLOAT   default_value:\"7.5\"       name:\"foo\" label:LABEL_REQUIRED number:1 }  field { type:TYPE_FLOAT   default_value:\"-8.5\"      name:\"foo\" label:LABEL_REQUIRED number:1 }  field { type:TYPE_FLOAT   default_value:\"9\"         name:\"foo\" label:LABEL_REQUIRED number:1 }  field { type:TYPE_DOUBLE  default_value:\"10.5\"      name:\"foo\" label:LABEL_REQUIRED number:1 }  field { type:TYPE_DOUBLE  default_value:\"-11.5\"     name:\"foo\" label:LABEL_REQUIRED number:1 }  field { type:TYPE_DOUBLE  default_value:\"12\"        name:\"foo\" label:LABEL_REQUIRED number:1 }  field { type:TYPE_DOUBLE  default_value:\"inf\"       name:\"foo\" label:LABEL_REQUIRED number:1 }  field { type:TYPE_DOUBLE  default_value:\"-inf\"      name:\"foo\" label:LABEL_REQUIRED number:1 }  field { type:TYPE_DOUBLE  default_value:\"nan\"       name:\"foo\" label:LABEL_REQUIRED number:1 }  field { type:TYPE_DOUBLE  default_value:\"-nan\"      name:\"foo\" label:LABEL_REQUIRED number:1 }  field { type:TYPE_STRING  default_value:\"13\\001\"   name:\"foo\" label:LABEL_REQUIRED number:1 }  field { type:TYPE_STRING  default_value:\"abc\"       name:\"foo\" label:LABEL_REQUIRED number:1 }  field { type:TYPE_BYTES   default_value:\"14\\\\002\" name:\"foo\" label:LABEL_REQUIRED number:1 }  field { type:TYPE_BYTES   default_value:\"abc\"       name:\"foo\" label:LABEL_REQUIRED number:1 }  field { type:TYPE_BOOL    default_value:\"true\"      name:\"foo\" label:LABEL_REQUIRED number:1 }..." /* TRUNCATED STRING LITERAL */
            );
  return;
}

Assistant:

TEST_F(ParseMessageTest, FieldDefaults) {
  ExpectParsesTo(
      "message TestMessage {\n"
      "  required int32  foo = 1 [default=  1  ];\n"
      "  required int32  foo = 1 [default= -2  ];\n"
      "  required int64  foo = 1 [default=  3  ];\n"
      "  required int64  foo = 1 [default= -4  ];\n"
      "  required uint32 foo = 1 [default=  5  ];\n"
      "  required uint64 foo = 1 [default=  6  ];\n"
      "  required float  foo = 1 [default=  7.5];\n"
      "  required float  foo = 1 [default= -8.5];\n"
      "  required float  foo = 1 [default=  9  ];\n"
      "  required double foo = 1 [default= 10.5];\n"
      "  required double foo = 1 [default=-11.5];\n"
      "  required double foo = 1 [default= 12  ];\n"
      "  required double foo = 1 [default= inf ];\n"
      "  required double foo = 1 [default=-inf ];\n"
      "  required double foo = 1 [default= nan ];\n"
      "  required double foo = 1 [default= -nan ];\n"
      "  required string foo = 1 [default='13\\001'];\n"
      "  required string foo = 1 [default='a' \"b\" \n \"c\"];\n"
      "  required bytes  foo = 1 [default='14\\002'];\n"
      "  required bytes  foo = 1 [default='a' \"b\" \n 'c'];\n"
      "  required bool   foo = 1 [default=true ];\n"
      "  required Foo    foo = 1 [default=FOO  ];\n"

      "  required int32  foo = 1 [default= 0x7FFFFFFF];\n"
      "  required int32  foo = 1 [default=-0x80000000];\n"
      "  required uint32 foo = 1 [default= 0xFFFFFFFF];\n"
      "  required int64  foo = 1 [default= 0x7FFFFFFFFFFFFFFF];\n"
      "  required int64  foo = 1 [default=-0x8000000000000000];\n"
      "  required uint64 foo = 1 [default= 0xFFFFFFFFFFFFFFFF];\n"
      "  required double foo = 1 [default= 0xabcd];\n"
      "}\n",

#define ETC "name:\"foo\" label:LABEL_REQUIRED number:1"
      "message_type {"
      "  name: \"TestMessage\""
      "  field { type:TYPE_INT32   default_value:\"1\"         " ETC
      " }"
      "  field { type:TYPE_INT32   default_value:\"-2\"        " ETC
      " }"
      "  field { type:TYPE_INT64   default_value:\"3\"         " ETC
      " }"
      "  field { type:TYPE_INT64   default_value:\"-4\"        " ETC
      " }"
      "  field { type:TYPE_UINT32  default_value:\"5\"         " ETC
      " }"
      "  field { type:TYPE_UINT64  default_value:\"6\"         " ETC
      " }"
      "  field { type:TYPE_FLOAT   default_value:\"7.5\"       " ETC
      " }"
      "  field { type:TYPE_FLOAT   default_value:\"-8.5\"      " ETC
      " }"
      "  field { type:TYPE_FLOAT   default_value:\"9\"         " ETC
      " }"
      "  field { type:TYPE_DOUBLE  default_value:\"10.5\"      " ETC
      " }"
      "  field { type:TYPE_DOUBLE  default_value:\"-11.5\"     " ETC
      " }"
      "  field { type:TYPE_DOUBLE  default_value:\"12\"        " ETC
      " }"
      "  field { type:TYPE_DOUBLE  default_value:\"inf\"       " ETC
      " }"
      "  field { type:TYPE_DOUBLE  default_value:\"-inf\"      " ETC
      " }"
      "  field { type:TYPE_DOUBLE  default_value:\"nan\"       " ETC
      " }"
      "  field { type:TYPE_DOUBLE  default_value:\"-nan\"      " ETC
      " }"
      "  field { type:TYPE_STRING  default_value:\"13\\001\"   " ETC
      " }"
      "  field { type:TYPE_STRING  default_value:\"abc\"       " ETC
      " }"
      "  field { type:TYPE_BYTES   default_value:\"14\\\\002\" " ETC
      " }"
      "  field { type:TYPE_BYTES   default_value:\"abc\"       " ETC
      " }"
      "  field { type:TYPE_BOOL    default_value:\"true\"      " ETC
      " }"
      "  field { type_name:\"Foo\" default_value:\"FOO\"       " ETC
      " }"

      "  field {"
      "    type:TYPE_INT32   default_value:\"2147483647\"           " ETC
      "  }"
      "  field {"
      "    type:TYPE_INT32   default_value:\"-2147483648\"          " ETC
      "  }"
      "  field {"
      "    type:TYPE_UINT32  default_value:\"4294967295\"           " ETC
      "  }"
      "  field {"
      "    type:TYPE_INT64   default_value:\"9223372036854775807\"  " ETC
      "  }"
      "  field {"
      "    type:TYPE_INT64   default_value:\"-9223372036854775808\" " ETC
      "  }"
      "  field {"
      "    type:TYPE_UINT64  default_value:\"18446744073709551615\" " ETC
      "  }"
      "  field {"
      "    type:TYPE_DOUBLE  default_value:\"43981\"                " ETC
      "  }"
      "}");
#undef ETC
}